

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diy-fp.cc
# Opt level: O0

void __thiscall FIX::double_conversion::DiyFp::Multiply(DiyFp *this,DiyFp *other)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint64_t result_f;
  uint64_t tmp;
  uint64_t bd;
  uint64_t ad;
  uint64_t bc;
  uint64_t ac;
  uint64_t d;
  uint64_t c;
  uint64_t b;
  uint64_t a;
  uint64_t kM32;
  DiyFp *other_local;
  DiyFp *this_local;
  
  uVar1 = this->f_ >> 0x20;
  uVar2 = this->f_ & 0xffffffff;
  uVar3 = other->f_ >> 0x20;
  uVar4 = other->f_ & 0xffffffff;
  uVar5 = uVar2 * uVar3;
  uVar6 = uVar1 * uVar4;
  this->e_ = other->e_ + 0x40 + this->e_;
  this->f_ = uVar1 * uVar3 + (uVar6 >> 0x20) + (uVar5 >> 0x20) +
             ((uVar2 * uVar4 >> 0x20) + (uVar6 & 0xffffffff) + (uVar5 & 0xffffffff) + 0x80000000 >>
             0x20);
  return;
}

Assistant:

void DiyFp::Multiply(const DiyFp& other) {
  // Simply "emulates" a 128 bit multiplication.
  // However: the resulting number only contains 64 bits. The least
  // significant 64 bits are only used for rounding the most significant 64
  // bits.
  const uint64_t kM32 = 0xFFFFFFFFU;
  uint64_t a = f_ >> 32;
  uint64_t b = f_ & kM32;
  uint64_t c = other.f_ >> 32;
  uint64_t d = other.f_ & kM32;
  uint64_t ac = a * c;
  uint64_t bc = b * c;
  uint64_t ad = a * d;
  uint64_t bd = b * d;
  uint64_t tmp = (bd >> 32) + (ad & kM32) + (bc & kM32);
  // By adding 1U << 31 to tmp we round the final result.
  // Halfway cases will be round up.
  tmp += 1U << 31;
  uint64_t result_f = ac + (ad >> 32) + (bc >> 32) + (tmp >> 32);
  e_ += other.e_ + 64;
  f_ = result_f;
}